

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O0

int obfuscate_object(int otyp)

{
  int local_10;
  int local_c;
  int otyp_local;
  
  if (otyp == 0) {
    local_c = 0;
  }
  else {
    local_10 = otyp + -1;
    if ((objects[local_10].field_0x10 & 1) == 0) {
      switch(otyp) {
      case 0xdf:
      case 0xe0:
      case 0xe1:
      case 0xe2:
        local_10 = 0xde;
        break;
      case 0xe9:
      case 0xea:
        local_10 = 0xe8;
        break;
      case 0xfb:
      case 0xfc:
        local_10 = 0xfa;
        break;
      case 0x1f1:
      case 0x1f2:
      case 499:
      case 500:
      case 0x1f5:
      case 0x1f6:
      case 0x1f7:
      case 0x1f8:
      case 0x1f9:
      case 0x1fa:
      case 0x1fb:
      case 0x1fc:
      case 0x1fd:
      case 0x1fe:
      case 0x1ff:
      case 0x200:
      case 0x201:
      case 0x202:
      case 0x203:
      case 0x204:
      case 0x205:
      case 0x206:
        switch(objects[local_10].oc_color) {
        case '\0':
          local_10 = 0x20c;
          break;
        case '\x01':
          local_10 = 0x208;
          break;
        case '\x02':
          local_10 = 0x20d;
          break;
        case '\x03':
          local_10 = 0x209;
          break;
        case '\x04':
          local_10 = 0x207;
          break;
        case '\x05':
          local_10 = 0x20e;
          break;
        case '\t':
          local_10 = 0x20a;
          break;
        case '\v':
          local_10 = 0x20b;
          break;
        case '\x0f':
          local_10 = 0x206;
        }
        break;
      case 0x210:
      case 0x211:
      case 0x212:
      case 0x213:
        local_10 = 0x212;
      }
    }
    local_c = objects[local_10].oc_descr_idx + 1;
  }
  return local_c;
}

Assistant:

int obfuscate_object(int otyp)
{
    if (!otyp)
	return 0;
    
    /* object ids are shifted by 1 for display, so that 0 can mean "no object" */
    otyp -= 1;
    
    if (!objects[otyp].oc_name_known) {
	switch (otyp) {
	    case SACK: case OILSKIN_SACK: case BAG_OF_TRICKS: case BAG_OF_HOLDING:
		otyp = SACK; break;

	    case LOADSTONE: case LUCKSTONE: case FLINT: case TOUCHSTONE: 
		otyp = FLINT; break;

	    case OIL_LAMP: case MAGIC_LAMP:
		otyp = OIL_LAMP; break;

	    case TIN_WHISTLE: case MAGIC_WHISTLE:
		otyp = TIN_WHISTLE; break;

	    /* all gems initially look like pieces of glass */
	    case DILITHIUM_CRYSTAL: case DIAMOND: case RUBY: case JACINTH:
	    case SAPPHIRE: case BLACK_OPAL: case EMERALD: case TURQUOISE:
	    case CITRINE: case AQUAMARINE: case AMBER: case TOPAZ: case JET:
	    case OPAL: case CHRYSOBERYL: case GARNET: case AMETHYST: case JASPER:
	    case FLUORITE: case OBSIDIAN: case AGATE: case JADE:
		switch (objects[otyp].oc_color) {
		    case CLR_WHITE: otyp = WORTHLESS_PIECE_OF_WHITE_GLASS; break;
		    case CLR_BLUE: otyp = WORTHLESS_PIECE_OF_BLUE_GLASS; break;
		    case CLR_RED: otyp = WORTHLESS_PIECE_OF_RED_GLASS; break;
		    case CLR_BROWN: otyp = WORTHLESS_PIECE_OF_YELLOWISH_BROWN_GLASS; break;
		    case CLR_ORANGE: otyp = WORTHLESS_PIECE_OF_ORANGE_GLASS; break;
		    case CLR_YELLOW: otyp = WORTHLESS_PIECE_OF_YELLOW_GLASS; break;
		    case CLR_BLACK: otyp = WORTHLESS_PIECE_OF_BLACK_GLASS; break;
		    case CLR_GREEN: otyp = WORTHLESS_PIECE_OF_GREEN_GLASS; break;
		    case CLR_MAGENTA: otyp = WORTHLESS_PIECE_OF_VIOLET_GLASS; break;
		}
		break;
	}
    }

    /* finally, account for shuffled descriptions */
    return objects[otyp].oc_descr_idx + 1;
}